

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

bool bcache_invalidate_block(filemgr *file,bid_t bid)

{
  byte bVar1;
  __pointer_type pfVar2;
  hash_elem *phVar3;
  atomic<unsigned_long> *atomic_val;
  ulong in_RSI;
  size_t shard_num;
  timeval tp;
  bool ret;
  fnamedic_item *fname;
  bcache_item query;
  bcache_item *item;
  hash_elem *h;
  undefined4 in_stack_ffffffffffffff68;
  memory_order in_stack_ffffffffffffff6c;
  atomic<unsigned_long> *in_stack_ffffffffffffff70;
  hash_elem *in_stack_ffffffffffffff78;
  hash *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar4;
  
  bVar4 = 0;
  pfVar2 = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x106120);
  if (pfVar2 != (__pointer_type)0x0) {
    gettimeofday((timeval *)&stack0xffffffffffffff78,(__timezone_ptr_t)0x0);
    atomic_store_uint64_t
              (in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),memory_order_relaxed);
    atomic_val = (atomic<unsigned_long> *)(in_RSI % pfVar2->num_shards);
    pthread_spin_lock(&pfVar2->shards[(long)atomic_val].lock);
    phVar3 = hash_find(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (phVar3 == (hash_elem *)0x0) {
      pthread_spin_unlock(&pfVar2->shards[(long)atomic_val].lock);
    }
    else {
      bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                        ((__atomic_base<unsigned_char> *)in_stack_ffffffffffffff78);
      if ((bVar1 & 4) != 0) {
        pthread_spin_unlock(&pfVar2->shards[(long)atomic_val].lock);
        return false;
      }
      bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                        ((__atomic_base<unsigned_char> *)in_stack_ffffffffffffff78);
      if ((bVar1 & 1) == 0) {
        atomic_decr_uint64_t(atomic_val,in_stack_ffffffffffffff6c);
        hash_remove((hash *)CONCAT17(bVar4,in_stack_ffffffffffffff88),
                    (hash_elem *)in_stack_ffffffffffffff80);
        list_remove(&pfVar2->shards[(long)atomic_val].cleanlist,(list_elem *)(phVar3 + 1));
        pthread_spin_unlock(&pfVar2->shards[(long)atomic_val].lock);
        _bcache_release_freeblock((bcache_item *)0x1062b2);
        bVar4 = 1;
      }
      else {
        std::__atomic_base<unsigned_char>::operator|=
                  ((__atomic_base<unsigned_char> *)&phVar3[1].avl.right,'\x02');
        atomic_incr_uint64_t(atomic_val,in_stack_ffffffffffffff6c);
        pthread_spin_unlock(&pfVar2->shards[(long)atomic_val].lock);
      }
    }
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool bcache_invalidate_block(struct filemgr *file, bid_t bid)
{
    struct hash_elem *h;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname;
    bool ret = false;

    // Note that we don't need to grab bcache_lock here as the block cache
    // is already created and binded when the file is created or opened for
    // the first time.
    fname = file->bcache;

    if (fname) {
        // file exists
        // set query
        query.bid = bid;
        // Update the access timestamp.
        struct timeval tp;
        gettimeofday(&tp, NULL);
        atomic_store_uint64_t(&fname->access_timestamp,
                              (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                              std::memory_order_relaxed);

        size_t shard_num = bid % fname->num_shards;
        spin_lock(&fname->shards[shard_num].lock);

        // search BHASH
        h = hash_find(&fname->shards[shard_num].hashtable, &query.hash_elem);
        if (h) {
            // cache hit
            item = _get_entry(h, struct bcache_item, hash_elem);
            if (item->flag & BCACHE_FREE) {
                spin_unlock(&fname->shards[shard_num].lock);
                DBG("Warning: failed to invalidate the buffer cache entry for a file '%s' "
                    "because the entry belongs to the free list!\n",
                    file->filename);
                return false;
            }

            if (!(item->flag & BCACHE_DIRTY)) {
                atomic_decr_uint64_t(&fname->nitems);
                // only for clean blocks
                // remove from hash and insert into freelist
                hash_remove(&fname->shards[shard_num].hashtable, &item->hash_elem);
                // remove from clean list
                list_remove(&fname->shards[shard_num].cleanlist, &item->list_elem);
                spin_unlock(&fname->shards[shard_num].lock);

                // add to freelist
                _bcache_release_freeblock(item);
                ret = true;
            } else {
                item->flag |= BCACHE_IMMUTABLE; // (stale index node block)
                atomic_incr_uint64_t(&fname->nimmutable);
                spin_unlock(&fname->shards[shard_num].lock);
            }
        } else {
            // cache miss
            spin_unlock(&fname->shards[shard_num].lock);
        }
    }
    return ret;
}